

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  HistorySuggestion *history;
  Printer *printer;
  bool bVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  uchar local_32;
  char local_31;
  
  iVar3 = isatty(__fd);
  if ((__fd == 0) && (iVar3 != 0)) {
    __tls_init();
    lVar4 = __tls_get_addr(&PTR_0010def8);
    bVar1 = yb::PrintBuffer::empty((PrintBuffer *)(lVar4 + 0x50));
    if (!bVar1) {
      __tls_init();
      yb::PrintBuffer::getNextChar((PrintBuffer *)(lVar4 + 0x50));
      if (local_31 == '\x01') {
        *(uchar *)__buf = local_32;
        __tls_init();
        yb::LineBuffer::insert((LineBuffer *)(lVar4 + 0x28),local_32);
      }
      return 1;
    }
  }
  lVar4 = __tls_get_addr(&PTR_0010def8);
  sVar5 = (**(code **)(lVar4 + 0x78))(__fd,__buf,__nbytes);
  iVar3 = isatty(__fd);
  if ((__fd == 0) && (iVar3 != 0)) {
    __tls_init();
    history = *(HistorySuggestion **)(lVar4 + 8);
    __tls_init();
    printer = *(Printer **)(lVar4 + 0x18);
    __tls_init();
    __tls_init();
    __tls_init();
    uVar2 = yb::yebash(history,printer,(LineBuffer *)(lVar4 + 0x28),(PrintBuffer *)(lVar4 + 0x50),
                       *(ArrowHandler **)(lVar4 + 0x20),*__buf);
    *(uchar *)__buf = uVar2;
  }
  return sVar5;
}

Assistant:

ssize_t read(int fd, void *buf, size_t count) {
    if (is_terminal_input(fd) && !printBuffer.empty()) {
        putCharToReadBuffer(static_cast<char *>(buf));
        return 1;
    }
    auto returnValue = realRead(fd, buf, count);
    if (is_terminal_input(fd)) {
        *static_cast<unsigned char *>(buf) = yb::yebash(*historySuggestion, *printer, lineBuffer, printBuffer, *arrowHandler, *static_cast<unsigned char *>(buf));
    }
    return returnValue;
}